

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::assembler(Forth *this)

{
  pointer piVar1;
  
  piVar1 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
    piVar1[-1] = this->widForthAssembler;
    return;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->searchOrder,&this->widForthAssembler);
  return;
}

Assistant:

void assembler(){
			if(searchOrder.size()>0){
				searchOrder[searchOrder.size()-1]=widForthAssembler;	
			}else {
				searchOrder.push_back(widForthAssembler);
			}	
		}